

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<double>::Truncate(RepeatedField<double> *this,int new_size)

{
  int iVar1;
  LogMessage *other;
  LogMessage local_60;
  LogFinisher local_21;
  
  iVar1 = this->current_size_;
  if (iVar1 < new_size) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/repeated_field.h"
               ,0x63d);
    other = internal::LogMessage::operator<<
                      (&local_60,"CHECK failed: (new_size) <= (current_size_): ");
    internal::LogFinisher::operator=(&local_21,other);
    internal::LogMessage::~LogMessage(&local_60);
    iVar1 = this->current_size_;
  }
  if (0 < iVar1) {
    this->current_size_ = new_size;
  }
  return;
}

Assistant:

inline void RepeatedField<Element>::Truncate(int new_size) {
  GOOGLE_DCHECK_LE(new_size, current_size_);
  if (current_size_ > 0) {
    current_size_ = new_size;
  }
}